

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArbitraryInteger.cpp
# Opt level: O3

bool __thiscall Refal2::CArbitraryInteger::SetValueByText(CArbitraryInteger *this,string *text)

{
  byte bVar1;
  pointer puVar2;
  size_type sVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  byte *pbVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  byte *pbVar11;
  TDigit digit;
  TDigit digit_00;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  CArbitraryInteger local_50;
  
  puVar2 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = puVar2;
  }
  this->isNegative = false;
  sVar3 = text->_M_string_length;
  if (sVar3 != 0) {
    pbVar7 = (byte *)(text->_M_dataplus)._M_p;
    bVar1 = *pbVar7;
    if ((bVar1 == 0x2d) || (pbVar11 = pbVar7, bVar1 == 0x2b)) {
      this->isNegative = bVar1 == 0x2d;
      pbVar11 = pbVar7 + 1;
    }
    digit = 1;
    if (pbVar11 == pbVar7 + sVar3) {
      digit_00 = 0;
    }
    else {
      iVar8 = 0;
      digit_00 = 0;
      do {
        if (9 < (byte)(*pbVar11 - 0x30)) {
          puVar2 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish != puVar2) {
            (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = puVar2;
          }
          this->isNegative = false;
          return false;
        }
        digit_00 = ((uint)*pbVar11 + digit_00 * 10) - 0x30;
        iVar8 = iVar8 + 1;
        if (iVar8 == 7) {
          CArbitraryInteger(&local_50,10000000);
          mul(this,&local_50);
          if (local_50.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_50.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          CArbitraryInteger(&local_50,digit_00);
          add(this,&local_50);
          if (local_50.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_50.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          pbVar7 = (byte *)(text->_M_dataplus)._M_p;
          sVar3 = text->_M_string_length;
          digit_00 = 0;
          iVar8 = 0;
        }
        pbVar11 = pbVar11 + 1;
      } while (pbVar11 != pbVar7 + sVar3);
      if (0 < iVar8) {
        uVar9 = iVar8 - 1;
        auVar15 = _DAT_00136010;
        iVar4 = 4;
        do {
          auVar12 = auVar15;
          auVar15._0_4_ = auVar12._0_4_ * 10;
          auVar13._8_4_ = (undefined4)((auVar12._8_8_ & 0xffffffff) * 10);
          auVar13._4_4_ = auVar13._8_4_;
          auVar13._0_4_ = auVar15._0_4_;
          iVar5 = auVar12._4_4_;
          auVar16._4_4_ = iVar5;
          auVar16._0_4_ = iVar5;
          auVar16._8_4_ = auVar12._12_4_;
          auVar16._12_4_ = auVar12._12_4_;
          auVar13._12_4_ = (int)((auVar16._8_8_ & 0xffffffff) * 10);
          auVar15._8_8_ = auVar13._8_8_;
          auVar15._4_4_ = iVar5 * 10;
          iVar5 = iVar4 + -4;
          iVar10 = iVar4 + (iVar8 + 3U & 0xfffffffc);
          iVar4 = iVar5;
        } while (iVar10 != 8);
        uVar6 = -iVar5;
        auVar14._0_4_ = -(uint)((int)(uVar9 ^ 0x80000000) < (int)(uVar6 ^ 0x80000000));
        auVar14._4_4_ = -(uint)((int)(uVar9 ^ 0x80000000) < (int)((uVar6 | 1) ^ 0x80000000));
        auVar14._8_4_ = -(uint)((int)(uVar9 ^ 0x80000000) < (int)((uVar6 | 2) ^ 0x80000000));
        auVar14._12_4_ = -(uint)((int)(uVar9 ^ 0x80000000) < (int)((uVar6 | 3) ^ 0x80000000));
        auVar15 = ~auVar14 & auVar15 | auVar12 & auVar14;
        digit = auVar15._8_4_ * auVar15._0_4_ * auVar15._4_4_ * auVar15._12_4_;
      }
    }
    CArbitraryInteger(&local_50,digit);
    mul(this,&local_50);
    if (local_50.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    CArbitraryInteger(&local_50,digit_00);
    add(this,&local_50);
    if (local_50.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return true;
}

Assistant:

bool CArbitraryInteger::SetValueByText( const std::string& text )
{
	Zero();
	if( text.empty() ) {
		return true;
	}
	std::string::const_iterator c = text.cbegin();
	if( *c == '-' || *c == '+' ) {
		SetSign( *c == '-' );
		++c;
	}
	TDigit digit = 0;
	const int maxDecimalDigits = 7;
	const TDigit maxDecimal = 10000000;
	static_assert( Base > maxDecimal, "too small Base" );
	int decimalCount = 0;
	for( ; c != text.cend(); ++c ) {
		if( *c >= '0' && *c <= '9' ) {
			digit = digit * 10 + ( *c - '0' );
			decimalCount++;
			if( decimalCount == maxDecimalDigits ) {
				mul( CArbitraryInteger( maxDecimal ) );
				add( CArbitraryInteger( digit ) );
				digit = 0;
				decimalCount = 0;
			}
		} else {
			Zero();
			return false;
		}
	}
	TDigit decimal = 1;
	for( ; decimalCount > 0; decimalCount-- ) {
		decimal *= 10;
	}
	mul( CArbitraryInteger( decimal ) );
	add( CArbitraryInteger( digit ) );
	return true;
}